

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O0

Tetris * __thiscall Tetris::set(Tetris *this,int x,int y,int o)

{
  int local_2c;
  int local_28;
  int local_24;
  int o_local;
  int y_local;
  int x_local;
  Tetris *this_local;
  
  local_24 = x;
  if (x == -1) {
    local_24 = this->blockX;
  }
  this->blockX = local_24;
  local_28 = y;
  if (y == -1) {
    local_28 = this->blockY;
  }
  this->blockY = local_28;
  local_2c = o;
  if (o == -1) {
    local_2c = this->orientation;
  }
  this->orientation = local_2c;
  return this;
}

Assistant:

Tetris &Tetris::set(int x, int y, int o)
{
    blockX = x == -1 ? blockX : x;
    blockY = y == -1 ? blockY : y;
    orientation = o == -1 ? orientation : o;
    return *this;
}